

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O1

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,DryHandler>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,DryHandler *handler)

{
  Ch CVar1;
  Ch *pCVar2;
  Ch *pCVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  byte *pbVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  byte bVar13;
  byte *pbVar14;
  int iVar15;
  byte bVar16;
  long lVar17;
  bool bVar18;
  double dVar19;
  double dVar20;
  undefined1 in_ZMM0 [64];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar23 [64];
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM4_Qb;
  
  bVar13 = *is->src_;
  if (bVar13 < 0x6e) {
    if (bVar13 == 0x22) {
      ParseString<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,DryHandler>
                (this,is,handler,false);
      return;
    }
    if (bVar13 == 0x5b) {
      if (*is->src_ != '[') {
        __assert_fail("is.Peek() == \'[\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                      ,0x327,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
                     );
      }
      pbVar9 = is->src_ + 1;
      is->src_ = pbVar9;
      while (((ulong)*pbVar9 < 0x21 && ((0x100002600U >> ((ulong)*pbVar9 & 0x3f) & 1) != 0))) {
        pbVar9 = pbVar9 + 1;
      }
      is->src_ = pbVar9;
      if (*(int *)(this + 0x30) == 0) {
        if (*pbVar9 == 0x5d) {
          is->src_ = pbVar9 + 1;
        }
        else {
          ParseArray<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,DryHandler>();
        }
      }
      return;
    }
    if (bVar13 != 0x66) {
      ParseNumber<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,DryHandler>
                (this,is,handler);
      return;
    }
    pCVar2 = is->src_;
    if (*pCVar2 != 'f') {
      __assert_fail("is.Peek() == \'f\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                    ,0x371,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
                   );
    }
    is->src_ = pCVar2 + 1;
    if ((((pCVar2[1] == 'a') && (is->src_ = pCVar2 + 2, pCVar2[2] == 'l')) &&
        (is->src_ = pCVar2 + 3, pCVar2[3] == 's')) && (is->src_ = pCVar2 + 4, pCVar2[4] == 'e')) {
      is->src_ = pCVar2 + 5;
    }
    else {
      ParseFalse<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,DryHandler>();
    }
    return;
  }
  if (bVar13 == 0x7b) {
    if (*is->src_ != '{') {
      __assert_fail("is.Peek() == \'{\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                    ,0x2e3,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
                   );
    }
    pbVar9 = is->src_ + 1;
    is->src_ = pbVar9;
    while (((ulong)*pbVar9 < 0x21 && ((0x100002600U >> ((ulong)*pbVar9 & 0x3f) & 1) != 0))) {
      pbVar9 = pbVar9 + 1;
    }
    is->src_ = pbVar9;
    if (*(int *)(this + 0x30) == 0) {
      if (*pbVar9 == 0x7d) {
        is->src_ = pbVar9 + 1;
      }
      else {
        ParseObject<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,DryHandler>();
      }
    }
    return;
  }
  if (bVar13 == 0x74) {
    pCVar2 = is->src_;
    if (*pCVar2 != 't') {
      __assert_fail("is.Peek() == \'t\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                    ,0x364,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
                   );
    }
    is->src_ = pCVar2 + 1;
    if (((pCVar2[1] == 'r') && (is->src_ = pCVar2 + 2, pCVar2[2] == 'u')) &&
       (is->src_ = pCVar2 + 3, pCVar2[3] == 'e')) {
      is->src_ = pCVar2 + 4;
    }
    else {
      ParseTrue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,DryHandler>();
    }
    return;
  }
  if (bVar13 == 0x6e) {
    ParseNull<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,DryHandler>(this,is,handler);
    return;
  }
  pCVar2 = is->src_;
  pCVar3 = is->head_;
  CVar1 = *pCVar2;
  pbVar9 = pCVar2 + (CVar1 == '-');
  bVar13 = pCVar2[CVar1 == '-'];
  if (bVar13 == 0x30) {
    pbVar14 = pbVar9 + 1;
    bVar5 = false;
    iVar10 = 0;
    uVar12 = 0;
    uVar8 = 0;
    goto LAB_00101d55;
  }
  if ((byte)(bVar13 - 0x31) < 9) {
    uVar8 = bVar13 - 0x30;
    bVar13 = pbVar9[1];
    pbVar14 = pbVar9 + 1;
    if (CVar1 == '-') {
      if ((byte)(bVar13 - 0x30) < 10) {
        iVar10 = 0;
        do {
          if ((0xccccccb < uVar8) && (0x38 < bVar13 || uVar8 != 0xccccccc)) goto LAB_00101d4b;
          uVar8 = (bVar13 - 0x30) + uVar8 * 10;
          iVar10 = iVar10 + 1;
          bVar13 = pbVar14[1];
          pbVar14 = pbVar14 + 1;
        } while ((byte)(bVar13 - 0x30) < 10);
      }
      else {
LAB_0010225c:
        iVar10 = 0;
      }
    }
    else {
      if (9 < (byte)(bVar13 - 0x30)) goto LAB_0010225c;
      iVar10 = 0;
      do {
        if ((0x19999998 < uVar8) && (0x35 < bVar13 || uVar8 != 0x19999999)) goto LAB_00101d4b;
        uVar8 = (bVar13 - 0x30) + uVar8 * 10;
        iVar10 = iVar10 + 1;
        bVar13 = pbVar14[1];
        pbVar14 = pbVar14 + 1;
      } while ((byte)(bVar13 - 0x30) < 10);
    }
    bVar5 = false;
    uVar12 = 0;
    goto LAB_00101d55;
  }
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                  ,0x5fc,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
                 );
  }
  lVar17 = (long)pbVar9 - (long)pCVar3;
  *(undefined4 *)(this + 0x30) = 3;
  goto LAB_001021d2;
LAB_00101d4b:
  bVar5 = true;
  uVar12 = (ulong)uVar8;
LAB_00101d55:
  auVar21 = ZEXT816(0) << 0x40;
  if (bVar5) {
    bVar16 = *pbVar14;
    bVar13 = bVar16 - 0x30;
    if (CVar1 == '-') {
      while (bVar13 < 10) {
        if ((0xccccccccccccccb < uVar12) && (uVar12 != 0xccccccccccccccc || 0x38 < bVar16))
        goto LAB_00101e1f;
        uVar12 = (ulong)(bVar16 & 0xf) + uVar12 * 10;
        iVar10 = iVar10 + 1;
        bVar16 = pbVar14[1];
        pbVar14 = pbVar14 + 1;
        bVar13 = bVar16 - 0x30;
      }
    }
    else {
      while (bVar13 < 10) {
        if ((0x1999999999999998 < uVar12) && (uVar12 != 0x1999999999999999 || 0x35 < bVar16))
        goto LAB_00101e1f;
        uVar12 = (ulong)(bVar16 & 0xf) + uVar12 * 10;
        iVar10 = iVar10 + 1;
        bVar16 = pbVar14[1];
        pbVar14 = pbVar14 + 1;
        bVar13 = bVar16 - 0x30;
      }
    }
  }
  bVar6 = false;
  goto LAB_00101e2d;
LAB_00101e1f:
  auVar21 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,uVar12);
  bVar6 = true;
LAB_00101e2d:
  auVar23 = ZEXT1664(auVar21);
  if ((bVar6) && (bVar13 = *pbVar14, (byte)(bVar13 - 0x30) < 10)) {
    do {
      auVar21._0_8_ = (double)(int)(bVar13 - 0x30);
      auVar21._8_8_ = in_ZMM2._8_8_;
      auVar21 = vfmadd132sd_fma(auVar23._0_16_,auVar21,ZEXT816(0x4024000000000000));
      auVar23 = ZEXT1664(auVar21);
      bVar13 = pbVar14[1];
      pbVar14 = pbVar14 + 1;
    } while ((byte)(bVar13 - 0x30) < 10);
  }
  dVar19 = auVar23._0_8_;
  pbVar9 = pbVar14 + (*pbVar14 == 0x2e);
  iVar15 = 0;
  if (*pbVar14 == 0x2e) {
    if (0xf5 < (byte)(*pbVar9 - 0x3a)) {
      iVar15 = 0;
      if (!bVar6) {
        uVar11 = (ulong)uVar8;
        if (bVar5) {
          uVar11 = uVar12;
        }
        uVar12 = uVar11;
        bVar13 = *pbVar9;
        iVar15 = 0;
        if ((0xf5 < (byte)(bVar13 - 0x3a)) && (iVar15 = 0, uVar12 < 0x20000000000000)) {
          lVar17 = 0;
          do {
            uVar12 = (ulong)(bVar13 & 0xf) + uVar12 * 10;
            iVar10 = (uint)(uVar12 != 0) + iVar10;
            bVar13 = pbVar9[lVar17 + 1];
            lVar17 = lVar17 + 1;
            if ((byte)(bVar13 - 0x3a) < 0xf6) break;
          } while (uVar12 < 0x20000000000000);
          iVar15 = -(int)lVar17;
          pbVar9 = pbVar9 + lVar17;
        }
        auVar21 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,uVar12);
        auVar23 = ZEXT1664(auVar21);
        bVar6 = true;
      }
      dVar19 = auVar23._0_8_;
      bVar13 = *pbVar9;
      if ((byte)(bVar13 - 0x30) < 10) {
        do {
          if (iVar10 < 0x11) {
            auVar22._0_8_ = (double)(int)(bVar13 - 0x30);
            auVar22._8_8_ = in_XMM4_Qb;
            auVar21 = vfmadd231sd_fma(auVar22,auVar23._0_16_,ZEXT816(0x4024000000000000));
            iVar15 = iVar15 + -1;
            if (0.0 < auVar21._0_8_) {
              iVar10 = iVar10 + 1;
            }
            auVar23 = ZEXT1664(auVar21);
          }
          dVar19 = auVar23._0_8_;
          bVar13 = pbVar9[1];
          pbVar9 = pbVar9 + 1;
        } while ((byte)(bVar13 - 0x30) < 10);
      }
      goto LAB_00101f74;
    }
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                    ,0x627,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
                   );
    }
    lVar17 = (long)pbVar9 - (long)pCVar3;
    *(undefined4 *)(this + 0x30) = 0xe;
  }
  else {
LAB_00101f74:
    lVar17 = (long)pCVar2 - (long)pCVar3;
    bVar13 = *pbVar9;
    pbVar9 = pbVar9 + (bVar13 == 0x65);
    if (bVar13 == 0x65) {
LAB_00101fb5:
      uVar11 = (ulong)uVar8;
      if (bVar5) {
        uVar11 = uVar12;
      }
      bVar5 = true;
      if (bVar6 != false) {
        bVar5 = bVar6;
      }
      bVar13 = *pbVar9;
      pbVar9 = pbVar9 + (bVar13 == 0x2b);
      bVar18 = false;
      if (bVar13 != 0x2b) {
        bVar18 = *pbVar9 == 0x2d;
        pbVar9 = pbVar9 + bVar18;
      }
      bVar13 = *pbVar9;
      if ((byte)(bVar13 - 0x30) < 10) {
        pbVar9 = pbVar9 + 1;
        iVar10 = bVar13 - 0x30;
        if (bVar18) {
          if (0 < iVar15) {
            __assert_fail("expFrac <= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                          ,0x667,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
                         );
          }
          bVar13 = *pbVar9;
          if ((byte)(bVar13 - 0x30) < 10) {
            do {
              iVar10 = (bVar13 - 0x30) + iVar10 * 10;
              if ((iVar15 + 0x7ffffff7) / 10 < iVar10) {
                do {
                  pbVar14 = pbVar9 + 1;
                  pbVar9 = pbVar9 + 1;
                } while ((byte)(*pbVar14 - 0x30) < 10);
              }
              else {
                pbVar9 = pbVar9 + 1;
              }
              bVar13 = *pbVar9;
            } while ((byte)(bVar13 - 0x30) < 10);
          }
        }
        else {
          do {
            bVar13 = *pbVar9;
            bVar16 = bVar13 - 0x30;
            if (9 < bVar16) goto LAB_001020d5;
            pbVar9 = pbVar9 + 1;
            iVar10 = (bVar13 - 0x30) + iVar10 * 10;
          } while (iVar10 <= 0x134 - iVar15);
          ParseNumber<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,DryHandler>();
LAB_001020d5:
          if (bVar16 < 10) {
            bVar18 = false;
            goto LAB_001020ff;
          }
        }
        iVar7 = -iVar10;
        if (!bVar18) {
          iVar7 = iVar10;
        }
        iVar10 = iVar7;
        bVar18 = true;
      }
      else {
        ParseNumber<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,DryHandler>();
        bVar18 = false;
        iVar10 = 0;
      }
LAB_001020ff:
      if (!bVar18) goto LAB_001021d6;
      auVar4._8_8_ = in_XMM4_Qb;
      auVar4._0_8_ = in_XMM4_Qa;
      auVar21 = vcvtusi2sd_avx512f(auVar4,uVar11);
      dVar19 = (double)((ulong)bVar6 * (long)dVar19 + (ulong)!bVar6 * auVar21._0_8_);
      bVar6 = bVar5;
    }
    else {
      bVar13 = *pbVar9;
      pbVar9 = pbVar9 + (bVar13 == 0x45);
      iVar10 = 0;
      if (bVar13 == 0x45) goto LAB_00101fb5;
    }
    if (bVar6 == false) goto LAB_001021d6;
    uVar8 = iVar10 + iVar15;
    if ((int)uVar8 < -0x134) {
      dVar20 = 0.0;
      if (-0x269 < (int)uVar8) {
        if (0x134 < -uVar8 - 0x134) goto LAB_00102284;
        dVar20 = (dVar19 / 1e+308) /
                 *(double *)(internal::Pow10(int)::e + (ulong)(-uVar8 - 0x134) * 8);
      }
    }
    else if ((int)uVar8 < 0) {
      if (0x134 < -uVar8) goto LAB_00102284;
      dVar20 = dVar19 / *(double *)(internal::Pow10(int)::e + (ulong)-uVar8 * 8);
    }
    else {
      if (0x134 < uVar8) {
LAB_00102284:
        __assert_fail("n >= 0 && n <= 308",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/internal/pow10.h"
                      ,0x30,"double rapidjson::internal::Pow10(int)");
      }
      dVar20 = dVar19 * *(double *)(internal::Pow10(int)::e + (ulong)uVar8 * 8);
    }
    if (dVar20 <= 1.79769313486232e+308) goto LAB_001021d6;
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                    ,0x6ab,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = DryHandler]"
                   );
    }
    *(undefined4 *)(this + 0x30) = 0xd;
  }
LAB_001021d2:
  *(long *)(this + 0x38) = lVar17;
LAB_001021d6:
  is->src_ = pbVar9;
  return;
}

Assistant:

Ch Peek() const { return *src_; }